

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog_util.c
# Opt level: O3

int read_full_contents(file_stream *strm)

{
  void *__ptr;
  void *__ptr_00;
  ssize_t sVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  size_t __size;
  
  __size = 0x1000;
  __ptr = xmalloc(0x1000);
  if (__ptr == (void *)0x0) {
    iVar4 = -1;
  }
  else {
    uVar2 = 0;
    do {
      __ptr_00 = __ptr;
      if (uVar2 == __size) {
        if (uVar2 != 0xffffffffffffffff) {
          __size = uVar2 * 2;
          if (CARRY8(uVar2,uVar2)) {
            __size = 0xffffffffffffffff;
          }
          __ptr_00 = realloc(__ptr,__size);
          if (__ptr_00 != (void *)0x0) goto LAB_001064cb;
        }
        msg("Out of memory!  %s is too large to be processed by this program as currently implemented."
            ,strm->name);
        uVar3 = 0xffffffff;
        __ptr_00 = __ptr;
LAB_0010652a:
        free(__ptr_00);
        return uVar3;
      }
LAB_001064cb:
      sVar1 = xread(strm,(void *)((long)__ptr_00 + uVar2),__size - uVar2);
      uVar3 = (uint)sVar1;
      if ((int)uVar3 < 0) goto LAB_0010652a;
      uVar2 = uVar2 + (uVar3 & 0x7fffffff);
      __ptr = __ptr_00;
    } while (uVar3 != 0);
    strm->mmap_mem = __ptr_00;
    strm->mmap_size = uVar2;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int
read_full_contents(struct file_stream *strm)
{
	size_t filled = 0;
	size_t capacity = 4096;
	char *buf;
	int ret;

	buf = xmalloc(capacity);
	if (buf == NULL)
		return -1;
	do {
		if (filled == capacity) {
			char *newbuf;

			if (capacity == SIZE_MAX)
				goto oom;
			capacity += MIN(SIZE_MAX - capacity, capacity);
			newbuf = realloc(buf, capacity);
			if (newbuf == NULL)
				goto oom;
			buf = newbuf;
		}
		ret = xread(strm, &buf[filled], capacity - filled);
		if (ret < 0)
			goto err;
		filled += ret;
	} while (ret != 0);

	strm->mmap_mem = buf;
	strm->mmap_size = filled;
	return 0;

err:
	free(buf);
	return ret;
oom:
	msg("Out of memory!  %"TS" is too large to be processed by "
	    "this program as currently implemented.", strm->name);
	ret = -1;
	goto err;
}